

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTPNSelf::gen_code_member
          (CTPNSelf *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  undefined4 in_EAX;
  uint uVar4;
  CTcNamedArgs *pCVar5;
  size_t __n;
  CTcGenTarg *pCVar6;
  undefined4 uStack_38;
  int local_34;
  
  _uStack_38 = CONCAT44(discard,in_EAX);
  if ((G_cs->field_0xa8 & 1) == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  if (((~G_cg->field_0xd0 & 0x18) == 0) &&
     ((argc != 0 || ((named_args != (CTcNamedArgs *)0x0 && (named_args->cnt != 0)))))) {
    err_throw(0x9c5);
  }
  pCVar5 = named_args;
  uVar4 = (*(prop_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                    (prop_expr,0,(ulong)(uint)prop_is_expr);
  __n = CONCAT71((int7)((ulong)pCVar5 >> 8),G_cg->field_0xd0) & 0xffffffffffffff18;
  if ((short)uVar4 == 0) {
    if ((char)__n == '\x18') {
      CTcGenTarg::write_op(G_cg,0x84);
      pCVar6 = G_cg;
      CTcGenTarg::write_op(G_cg,'i');
      pCVar3 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (pCVar3->max_sp_depth_ <= iVar2) {
        pCVar3->max_sp_depth_ = iVar1;
      }
      pCVar3->sp_depth_ = pCVar3->sp_depth_ + -2;
    }
    else {
      if (varargs != 0) {
        CTcGenTarg::write_op(G_cg,0x8d);
        CTcGenTarg::write_op(G_cg,'v');
      }
      CTcGenTarg::write_op(G_cg,'e');
      uStack_38 = CONCAT13((char)argc,(undefined3)uStack_38);
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 3,(void *)0x1,__n);
      G_cg->sp_depth_ = G_cg->sp_depth_ + ~argc;
    }
  }
  else {
    uVar4 = uVar4 & 0xffff;
    if ((char)__n == '\x18') {
      CTcGenTarg::write_op(G_cg,0x84);
      CTcGenTarg::write_op(G_cg,'h');
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4);
      pCVar3 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (pCVar3->max_sp_depth_ <= iVar2) {
        pCVar3->max_sp_depth_ = iVar1;
      }
      pCVar3->sp_depth_ = pCVar3->sp_depth_ + -1;
    }
    else if (argc == 0) {
      CTcGenTarg::write_op(G_cg,'c');
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4);
    }
    else {
      if (varargs != 0) {
        CTcGenTarg::write_op(G_cg,'v');
      }
      CTcGenTarg::write_op(G_cg,'d');
      uStack_38._0_3_ = CONCAT12((char)argc,(undefined2)uStack_38);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 2,(void *)0x1,__n);
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4);
      G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
    }
  }
  CTcGenTarg::post_call_cleanup(pCVar6,named_args);
  if (local_34 == 0) {
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar6 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar6->max_sp_depth_ <= iVar2) {
      pCVar6->max_sp_depth_ = iVar1;
    }
  }
  return;
}

Assistant:

void CTPNSelf::gen_code_member(int discard,
                               CTcPrsNode *prop_expr, int prop_is_expr,
                               int argc, int varargs,
                               CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;
    
    /* make sure "self" is available */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* don't allow arguments in speculative eval mode */
    if (G_cg->is_speculative()
        && (argc != 0 || (named_args != 0 && named_args->cnt != 0)))
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple GETPROPSELF or
     *   CALLPROPSELF; otherwise, generate a PTRCALLPROPSELF 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* 
         *   we have a constant property ID - generate a GETPROPDATA,
         *   GETPROPSELF, or CALLPROPSELF with the property ID as
         *   immediate data 
         */
        if (G_cg->is_speculative())
        {
            /* speculative - use GETPROPDATA */
            G_cg->write_op(OPC_PUSHSELF);
            G_cg->write_op(OPC_GETPROPDATA);
            G_cs->write_prop_id(prop);

            /* we pushed one element (self) and popped it back off */
            G_cg->note_push();
            G_cg->note_pop();
        }
        else if (argc == 0)
        {
            /* no arguments - generate a GETPROPSELF */
            G_cg->write_op(OPC_GETPROPSELF);
            G_cs->write_prop_id(prop);
        }
        else
        {
            /* add a varargs modifier if appropriate */
            if (varargs)
                G_cg->write_op(OPC_VARARGC);
            
            /* we have arguments - generate a CALLPROPSELF */
            G_cg->write_op(OPC_CALLPROPSELF);
            G_cs->write((char)argc);
            G_cs->write_prop_id(prop);

            /* this removes arguments */
            G_cg->note_pop(argc);
        }
    }
    else
    {
        /* 
         *   a property pointer is on the stack - use PTRGETPROPDATA or
         *   PTRCALLPROPSELF, depending on the speculative mode 
         */
        if (G_cg->is_speculative())
        {
            /* speculative - use PTRGETPROPDATA after pushing self */
            G_cg->write_op(OPC_PUSHSELF);
            G_cg->write_op(OPC_PTRGETPROPDATA);

            /* we pushed self then removed self and the property ID */
            G_cg->note_push();
            G_cg->note_pop(2);
        }
        else
        {
            /* 
             *   if we have a varargs list, modify the call instruction
             *   that follows to make it a varargs call 
             */
            if (varargs)
            {
                /* swap to get the arg counter back on top */
                G_cg->write_op(OPC_SWAP);
                
                /* write the varargs modifier */
                G_cg->write_op(OPC_VARARGC);
            }

            /* a prop pointer is on the stack - write a PTRCALLPROPSELF */
            G_cg->write_op(OPC_PTRCALLPROPSELF);
            G_cs->write((int)argc);
            
            /* this removes arguments and the property pointer */
            G_cg->note_pop(argc + 1);
        }
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}